

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall soul::StructuralParser::parseTernaryOperator(StructuralParser *this)

{
  char *pcVar1;
  TernaryOp *args_1;
  Expression *args_2;
  Expression *args_3;
  Context context;
  Context local_38;
  
  args_1 = (TernaryOp *)parseLogicalOr(this);
  pcVar1 = (this->super_SOULTokeniser).currentType.text;
  if ((pcVar1 == "?") || (((pcVar1 != (char *)0x0 && (*pcVar1 == '?')) && (pcVar1[1] == '\0')))) {
    local_38.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
    if (local_38.location.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_38.location.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_38.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_38.location.location.data = (this->super_SOULTokeniser).location.location.data;
    local_38.parentScope = this->currentScope;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&this->super_SOULTokeniser);
    args_2 = parseTernaryOperator(this);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a4983);
    args_3 = parseTernaryOperator(this);
    args_1 = PoolAllocator::
             allocate<soul::AST::TernaryOp,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&,soul::AST::Expression&>
                       (&this->allocator->pool,&local_38,(Expression *)args_1,args_2,args_3);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_38.location.sourceCode.object);
  }
  return &args_1->super_Expression;
}

Assistant:

AST::Expression& parseTernaryOperator()
    {
        auto& a = parseLogicalOr();

        if (! matches (Operator::question))
            return a;

        auto context = getContext();
        skip();
        auto& trueBranch = parseTernaryOperator();
        expect (Operator::colon);
        auto& falseBranch = parseTernaryOperator();
        return allocate<AST::TernaryOp> (context, a, trueBranch, falseBranch);
    }